

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall icu_63::CollationRuleParser::setErrorContext(CollationRuleParser *this)

{
  UnicodeString *pUVar1;
  int iVar2;
  char16_t cVar3;
  int32_t iVar4;
  int _length;
  Char16Ptr local_38 [3];
  Char16Ptr local_20;
  int local_18;
  int local_14;
  int32_t length;
  int32_t start;
  CollationRuleParser *this_local;
  
  if (this->parseError != (UParseError *)0x0) {
    this->parseError->offset = this->ruleIndex;
    this->parseError->line = 0;
    local_14 = this->ruleIndex + -0xf;
    _length = this;
    if (local_14 < 0) {
      local_14 = 0;
    }
    else if ((0 < local_14) &&
            (cVar3 = UnicodeString::charAt(this->rules,local_14), (cVar3 & 0xfc00U) == 0xdc00)) {
      local_14 = local_14 + 1;
    }
    iVar2 = local_14;
    _length = this->ruleIndex - local_14;
    pUVar1 = this->rules;
    local_18 = _length;
    Char16Ptr::Char16Ptr(&local_20,this->parseError->preContext);
    UnicodeString::extract(pUVar1,iVar2,_length,&local_20,0);
    Char16Ptr::~Char16Ptr(&local_20);
    this->parseError->preContext[local_18] = L'\0';
    iVar4 = UnicodeString::length(this->rules);
    local_18 = iVar4 - this->ruleIndex;
    if (0xf < local_18) {
      local_18 = 0xf;
      cVar3 = UnicodeString::charAt(this->rules,this->ruleIndex + 0xe);
      if ((cVar3 & 0xfc00U) == 0xd800) {
        local_18 = local_18 + -1;
      }
    }
    iVar2 = local_18;
    iVar4 = this->ruleIndex;
    pUVar1 = this->rules;
    Char16Ptr::Char16Ptr(local_38,this->parseError->postContext);
    UnicodeString::extract(pUVar1,iVar4,iVar2,local_38,0);
    Char16Ptr::~Char16Ptr(local_38);
    this->parseError->postContext[local_18] = L'\0';
  }
  return;
}

Assistant:

void
CollationRuleParser::setErrorContext() {
    if(parseError == NULL) { return; }

    // Note: This relies on the calling code maintaining the ruleIndex
    // at a position that is useful for debugging.
    // For example, at the beginning of a reset or relation etc.
    parseError->offset = ruleIndex;
    parseError->line = 0;  // We are not counting line numbers.

    // before ruleIndex
    int32_t start = ruleIndex - (U_PARSE_CONTEXT_LEN - 1);
    if(start < 0) {
        start = 0;
    } else if(start > 0 && U16_IS_TRAIL(rules->charAt(start))) {
        ++start;
    }
    int32_t length = ruleIndex - start;
    rules->extract(start, length, parseError->preContext);
    parseError->preContext[length] = 0;

    // starting from ruleIndex
    length = rules->length() - ruleIndex;
    if(length >= U_PARSE_CONTEXT_LEN) {
        length = U_PARSE_CONTEXT_LEN - 1;
        if(U16_IS_LEAD(rules->charAt(ruleIndex + length - 1))) {
            --length;
        }
    }
    rules->extract(ruleIndex, length, parseError->postContext);
    parseError->postContext[length] = 0;
}